

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadCustomData(CrateReader *this,CustomDataType *d)

{
  StreamReader *pSVar1;
  uint uVar2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  mapped_type *this_00;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  vtable_type **ppvVar9;
  long lVar10;
  char cVar11;
  char cVar12;
  char *pcVar13;
  uint __len;
  MetaVariable var;
  string __str;
  int64_t offset;
  CrateValue value;
  ValueRep rep;
  CustomDataType dict;
  ostringstream ss_e;
  storage_union local_290;
  vtable_type *local_280;
  undefined1 *puStack_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  string local_258;
  ulong local_238;
  ulong local_230;
  storage_union local_228;
  undefined **local_218;
  CrateReader *local_210;
  ValueRep local_208;
  CustomDataType *local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  local_1d8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = StreamReader::read8(this->_sr,&local_238);
  if (bVar4) {
    if (local_238 <= (this->_config).maxDictElements) {
      bVar4 = local_238 != 0;
      local_238 = local_238 - 1;
      local_200 = d;
      if (bVar4) {
        local_210 = this;
        do {
          local_258._M_string_length = 0;
          local_258.field_2._M_local_buf[0] = '\0';
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          bVar4 = ReadString(this,&local_258);
          if (!bVar4) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadCustomData",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x6e6);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            pcVar13 = "Failed to read key string for Dictionary element.";
            lVar10 = 0x31;
LAB_001c2606:
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,pcVar13,lVar10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_290.dynamic);
            if ((vtable_type **)local_290.dynamic == &local_280) goto LAB_001c2667;
            goto LAB_001c265a;
          }
          local_230 = 0;
          bVar4 = StreamReader::read8(this->_sr,(int64_t *)&local_230);
          if (!bVar4) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadCustomData",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x6ed);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            pcVar13 = "Failed to read the offset for value in Dictionary.";
            lVar10 = 0x32;
            goto LAB_001c2606;
          }
          pSVar1 = this->_sr;
          uVar7 = (local_230 + pSVar1->idx_) - 8;
          if (((long)uVar7 < 0) || (pSVar1->length_ < uVar7)) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadCustomData",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x6f2);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            uVar7 = -local_230;
            if (0 < (long)local_230) {
              uVar7 = local_230;
            }
            __len = 1;
            if (uVar7 < 10) goto LAB_001c29e0;
            uVar8 = uVar7;
            uVar2 = 4;
            goto LAB_001c250a;
          }
          pSVar1->idx_ = uVar7;
          local_208.data = 0;
          bVar4 = ReadValueRep(this,&local_208);
          if (!bVar4) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadCustomData",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x6f9);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            pcVar13 = "Failed to read value for Dictionary element.";
            lVar10 = 0x2c;
            goto LAB_001c2606;
          }
          uVar7 = this->_sr->idx_;
          local_218 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_228.dynamic = (void *)0x0;
          bVar4 = UnpackValueRep(this,&local_208,(CrateValue *)&local_228);
          if (!bVar4) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadCustomData",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x702);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Failed to unpack value of Dictionary element.",0x2d);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)&local_210->_err,(ulong)local_290.dynamic);
            if ((vtable_type **)local_290.dynamic != &local_280) {
              operator_delete(local_290.dynamic,(ulong)((long)&local_280->type_id + 1));
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
            ::std::ios_base::~ios_base(local_138);
            if (local_218 != (undefined **)0x0) {
              (*(code *)local_218[4])(&local_228);
              local_218 = (undefined **)0x0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p == &local_258.field_2) goto LAB_001c269f;
            goto LAB_001c2692;
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::find(&local_1d8,&local_258);
          local_280 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_290.dynamic = (vtable_type **)0x0;
          local_270 = 0;
          local_268 = 0;
          puStack_278 = &local_268;
          linb::any::operator=((any *)&local_290,(any *)&local_228);
          ::std::__cxx11::string::_M_assign((string *)&puStack_278);
          this_00 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                  *)&local_1d8,&local_258);
          this = local_210;
          ::std::__cxx11::string::_M_assign((string *)&this_00->_name);
          linb::any::operator=((any *)this_00,(any *)&local_290);
          if (this->_sr->length_ < uVar7) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadCustomData",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x710);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Failed to set seek.",0x13);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8[0]);
            if (local_1f8[0] != local_1e8) {
              operator_delete(local_1f8[0],local_1e8[0] + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
            ::std::ios_base::~ios_base(local_138);
            if (puStack_278 != &local_268) {
              operator_delete(puStack_278,CONCAT71(uStack_267,local_268) + 1);
            }
            if (local_280 != (vtable_type *)0x0) {
              (*local_280->destroy)(&local_290);
              local_280 = (vtable_type *)0x0;
            }
            if (local_218 != (undefined **)0x0) {
              (*(code *)local_218[4])(&local_228);
              local_218 = (undefined **)0x0;
            }
            goto LAB_001c2688;
          }
          this->_sr->idx_ = uVar7;
          if (puStack_278 != &local_268) {
            operator_delete(puStack_278,CONCAT71(uStack_267,local_268) + 1);
          }
          if (local_280 != (vtable_type *)0x0) {
            (*local_280->destroy)(&local_290);
            local_280 = (vtable_type *)0x0;
          }
          if (local_218 != (undefined **)0x0) {
            (*(code *)local_218[4])(&local_228);
            local_218 = (undefined **)0x0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,
                            CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                     local_258.field_2._M_local_buf[0]) + 1);
          }
          bVar4 = local_238 != 0;
          local_238 = local_238 - 1;
        } while (bVar4);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
      ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   *)local_200,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   *)&local_1d8);
      bVar4 = true;
      goto LAB_001c26a1;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadCustomData",0xe);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x6dc);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "The number of elements for Dictionary data is too large. Max = ",0x3f);
    uVar7 = (this->_config).maxDictElements;
    cVar11 = '\x01';
    cVar12 = '\x01';
    if (9 < uVar7) {
      uVar8 = uVar7;
      cVar3 = '\x04';
      do {
        cVar12 = cVar3;
        if (uVar8 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_001c2124;
        }
        if (uVar8 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_001c2124;
        }
        if (uVar8 < 10000) goto LAB_001c2124;
        bVar4 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar12 + '\x04';
      } while (bVar4);
      cVar12 = cVar12 + '\x01';
    }
LAB_001c2124:
    local_290.dynamic = &local_280;
    ::std::__cxx11::string::_M_construct((ulong)&local_290,cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_290.dynamic,local_290._8_4_,uVar7);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_290.dynamic,local_290._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,", but got ",10);
    uVar7 = local_238;
    if (9 < local_238) {
      uVar8 = local_238;
      cVar12 = '\x04';
      do {
        cVar11 = cVar12;
        if (uVar8 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_001c21d2;
        }
        if (uVar8 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_001c21d2;
        }
        if (uVar8 < 10000) goto LAB_001c21d2;
        bVar4 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar12 = cVar11 + '\x04';
      } while (bVar4);
      cVar11 = cVar11 + '\x01';
    }
LAB_001c21d2:
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_258,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_258._M_dataplus._M_p,(uint)local_258._M_string_length,uVar7);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_258._M_dataplus._M_p,local_258._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                               local_258.field_2._M_local_buf[0]) + 1);
    }
    if ((vtable_type **)local_290.dynamic != &local_280) {
      operator_delete(local_290.dynamic,(ulong)((long)&local_280->type_id + 1));
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_290.dynamic);
    if ((vtable_type **)local_290.dynamic != &local_280) {
      operator_delete(local_290.dynamic,(ulong)((long)&local_280->type_id + 1));
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base(local_138);
  }
  else {
    ::std::__cxx11::string::append((char *)&this->_err);
  }
  goto LAB_001c269f;
  while( true ) {
    if (uVar8 < 10000) goto LAB_001c29e0;
    bVar4 = uVar8 < 100000;
    uVar8 = uVar8 / 10000;
    uVar2 = __len + 4;
    if (bVar4) break;
LAB_001c250a:
    __len = uVar2;
    if (uVar8 < 100) {
      __len = __len - 2;
      goto LAB_001c29e0;
    }
    if (uVar8 < 1000) {
      __len = __len - 1;
      goto LAB_001c29e0;
    }
  }
  __len = __len + 1;
LAB_001c29e0:
  lVar10 = (long)local_230 >> 0x3f;
  local_1f8[0] = local_1e8;
  ::std::__cxx11::string::_M_construct
            ((ulong)local_1f8,(char)__len - (char)((long)local_230 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_1f8[0] - lVar10),__len,uVar7);
  plVar6 = (long *)::std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x3fb22a);
  ppvVar9 = (vtable_type **)(plVar6 + 2);
  if ((vtable_type **)*plVar6 == ppvVar9) {
    local_280 = *ppvVar9;
    puStack_278 = (undefined1 *)plVar6[3];
    local_290.dynamic = &local_280;
  }
  else {
    local_280 = *ppvVar9;
    local_290.dynamic = (vtable_type **)*plVar6;
  }
  local_290._8_8_ = plVar6[1];
  *plVar6 = (long)ppvVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_290.dynamic,local_290._8_8_);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if ((vtable_type **)local_290.dynamic != &local_280) {
    operator_delete(local_290.dynamic,(ulong)((long)&local_280->type_id + 1));
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_290.dynamic);
  if ((vtable_type **)local_290.dynamic != &local_280) {
LAB_001c265a:
    operator_delete(local_290.dynamic,(ulong)((long)&local_280->type_id + 1));
  }
LAB_001c2667:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
LAB_001c2688:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
LAB_001c2692:
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
LAB_001c269f:
  bVar4 = false;
LAB_001c26a1:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  ::_M_erase(&local_1d8,(_Link_type)local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar4;
}

Assistant:

bool CrateReader::ReadCustomData(CustomDataType *d) {
  CustomDataType dict;
  uint64_t sz;
  if (!_sr->read8(&sz)) {
    _err += "Failed to read the number of elements for Dictionary data.\n";
    return false;
  }

  if (sz > _config.maxDictElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "The number of elements for Dictionary data is too large. Max = " << std::to_string(_config.maxDictElements) << ", but got " << std::to_string(sz));
  }

  DCOUT("# o elements in dict" << sz);

  while (sz--) {
    // key(StringIndex)
    std::string key;

    if (!ReadString(&key)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read key string for Dictionary element.");
    }

    // 8byte for the offset for recursive value. See RecursiveRead() in
    // crateFile.cpp for details.
    int64_t offset{0};
    if (!_sr->read8(&offset)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the offset for value in Dictionary.");
    }

    // -8 to compensate sizeof(offset)
    if (!_sr->seek_from_current(offset - 8)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek. Invalid offset value: " + std::to_string(offset));
    }

    DCOUT("key = " << key);

    crate::ValueRep rep{0};
    if (!ReadValueRep(&rep)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read value for Dictionary element.");
    }

    DCOUT("vrep =" << crate::GetCrateDataTypeName(rep.GetType()));

    auto saved_position = _sr->tell();

    crate::CrateValue value;
    if (!UnpackValueRep(rep, &value)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to unpack value of Dictionary element.");
    }

    if (dict.count(key)) {
      // Duplicated key. maybe ok?
    }
    // CrateValue -> MetaVariable
    MetaVariable var;

    var.set_value(key, value.get_raw());

    dict[key] = var;

    if (!_sr->seek_set(saved_position)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to set seek.");
    }
  }

  (*d) = std::move(dict);
  return true;
}